

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::
GetPropertyFromDescriptor<false,JsUtil::CharacterBuffer<char16_t>>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,Var originalInstance,
          DictionaryPropertyDescriptor<int> *descriptor,Var *value,PropertyValueInfo *info,
          CharacterBuffer<char16_t> *propertyT,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  
  bVar3 = descriptor->Attributes;
  if (((bVar3 & 0x10) != 0) &&
     ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
      TypeIds_GlobalObject)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x202,"(!isLetConstGlobal || VarIs<RootObjectBase>(instance))",
                                "object must be a global object if letconstglobal is set");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    bVar3 = descriptor->Attributes;
  }
  BVar4 = 0;
  if (((((descriptor->flags & IsShadowed) == None) << 4 | 8U) & bVar3) == 0) {
    iVar5 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(descriptor);
    if (iVar5 == -1) {
      iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
      if (iVar5 == -1) {
        pRVar8 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
        if (info == (PropertyValueInfo *)0x0) {
          CacheOperators::CachePropertyReadForGetter
                    ((PropertyValueInfo *)0x0,originalInstance,propertyT,requestContext);
        }
        else {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
          CacheOperators::CachePropertyReadForGetter(info,originalInstance,propertyT,requestContext)
          ;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
        iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
        pvVar7 = DynamicObject::GetSlot(instance,iVar5);
        pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
        pRVar8 = (RecyclableObject *)
                 JavascriptOperators::CallGetter(pRVar8,originalInstance,requestContext);
      }
      *value = pRVar8;
    }
    else {
      pvVar7 = DynamicObject::GetSlot(instance,iVar5);
      *value = pvVar7;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,iVar5,descriptor);
    }
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetPropertyFromDescriptor(DynamicObject* instance, Var originalInstance,
        DictionaryPropertyDescriptor<T>* descriptor, Var* value, PropertyValueInfo* info, PropertyType propertyT, ScriptContext* requestContext)
    {
        bool const isLetConstGlobal = (descriptor->Attributes & PropertyLetConstGlobal) != 0;
        AssertMsg(!isLetConstGlobal || VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
        if (allowLetConstGlobal)
        {
            // GetRootProperty: false if not global
            if (!(descriptor->Attributes & PropertyLetConstGlobal) && (descriptor->Attributes & PropertyDeleted))
            {
                return false;
            }
        }
        else
        {
            // GetProperty: don't count deleted or global.
            if (descriptor->Attributes & (PropertyDeleted | (descriptor->GetIsShadowed() ? 0 : PropertyLetConstGlobal)))
            {
                return false;
            }
        }

        T dataSlot = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlot != NoSlots)
        {
            *value = instance->GetSlot(dataSlot);
            SetPropertyValueInfo(info, instance, dataSlot, descriptor);
        }
        else if (descriptor->GetGetterPropertyIndex() != NoSlots)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetGetterPropertyIndex(), descriptor->Attributes);
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyT, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(descriptor->GetGetterPropertyIndex()));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
            return true;
        }
        return true;
    }